

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

void * metacallfmv_await_s(void *func,void **keys,void **values,size_t size,
                          _func_void_ptr_void_ptr_void_ptr *resolve_callback,
                          _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  int iVar1;
  type_id tVar2;
  uint uVar3;
  type_id tVar4;
  signature s;
  value pvVar5;
  char *pcVar6;
  size_t sVar7;
  type ptVar8;
  function_return v;
  size_t index;
  void *args [16];
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    for (index = 0; size != index; index = index + 1) {
      iVar1 = value_validate(keys[index]);
      if (iVar1 != 0) {
        pcVar6 = "Invalid key at position %zu when calling to metacallfmv_await_s";
        sVar7 = 0x6c6;
LAB_001268aa:
        log_write_impl_va("metacall",sVar7,"metacallfmv_await_s",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,pcVar6,index);
        return (void *)0x0;
      }
      iVar1 = value_validate(values[index]);
      if (iVar1 != 0) {
        pcVar6 = "Invalid value at position %zu when calling to metacallfmv_await_s";
        sVar7 = 0x6cd;
        goto LAB_001268aa;
      }
      tVar2 = value_type_id(keys[index]);
      iVar1 = type_id_string(tVar2);
      if (iVar1 == 0) {
        pcVar6 = value_to_string(keys[index]);
        sVar7 = signature_get_index(s,pcVar6);
      }
      else {
        iVar1 = type_id_integer(tVar2);
        if (iVar1 != 0) {
          return (void *)0x0;
        }
        pvVar5 = value_type_cast(keys[index],3);
        if (pvVar5 == (value)0x0) {
          pvVar5 = keys[index];
        }
        else {
          keys[index] = pvVar5;
        }
        uVar3 = value_to_int(pvVar5);
        if (0xf < uVar3) {
          return (void *)0x0;
        }
        sVar7 = (size_t)uVar3;
      }
      if (0xf < sVar7) {
        return (void *)0x0;
      }
      ptVar8 = signature_get_type(s,index);
      if (ptVar8 != (type)0x0) {
        tVar2 = type_index(ptVar8);
        tVar4 = value_type_id(values[index]);
        if ((tVar2 != tVar4) &&
           (pvVar5 = value_type_cast(values[index],tVar2), pvVar5 != (value)0x0)) {
          values[index] = pvVar5;
        }
      }
      args[sVar7] = values[index];
    }
    v = function_await((function_conflict)func,args,size,(function_resolve_callback)resolve_callback
                       ,(function_reject_callback)reject_callback,data);
    if (v != (function_return)0x0) {
      ptVar8 = signature_get_return(s);
      if (ptVar8 == (type)0x0) {
        return v;
      }
      tVar2 = type_index(ptVar8);
      tVar4 = value_type_id(v);
      if (tVar2 != tVar4) {
        pvVar5 = value_type_cast(v,tVar2);
        if (pvVar5 != (value)0x0) {
          return pvVar5;
        }
        return v;
      }
      return v;
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfmv_await_s(void *func, void *keys[], void *values[], size_t size, void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	function f = (function)func;

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(keys[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid key at position %" PRIuS " when calling to metacallfmv_await_s", iterator);
				return NULL;
			}

			if (value_validate(values[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid value at position %" PRIuS " when calling to metacallfmv_await_s", iterator);
				return NULL;
			}

			type_id key_id = value_type_id((value)keys[iterator]);

			size_t index = METACALL_ARGS_SIZE;

			/* Obtain signature index */
			if (type_id_string(key_id) == 0)
			{
				const char *key = value_to_string(keys[iterator]);

				index = signature_get_index(s, key);
			}
			else if (type_id_integer(key_id) == 0)
			{
				value cast_key = value_type_cast((value)keys[iterator], TYPE_INT);

				int key_index;

				if (cast_key != NULL)
				{
					keys[iterator] = cast_key;
				}

				key_index = value_to_int((value)keys[iterator]);

				if (key_index >= 0 && key_index < METACALL_ARGS_SIZE)
				{
					index = (size_t)key_index;
				}
			}

			/* If index is valid, cast values and build arguments */
			if (index < METACALL_ARGS_SIZE)
			{
				type t = signature_get_type(s, iterator);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id((value)values[iterator]))
					{
						value cast_arg = value_type_cast((value)values[iterator], id);

						if (cast_arg != NULL)
						{
							values[iterator] = cast_arg;
						}
					}
				}

				args[index] = values[iterator];
			}
			else
			{
				/* TODO: Handle properly exceptions */
				return NULL;
			}
		}

		ret = function_await(f, args, size, resolve_callback, reject_callback, data);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}